

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_node_iterator_lower_bound(art_node_t *node,art_iterator_t *iterator,art_key_chunk_t *key)

{
  _Bool _Var1;
  int iVar2;
  art_iterator_t *iterator_00;
  long in_RDX;
  art_iterator_t *in_RSI;
  art_node_t *in_RDI;
  art_leaf_t *leaf;
  art_indexed_child_t indexed_child;
  art_key_chunk_t key_chunk;
  int prefix_comparison;
  art_inner_node_t *inner_node;
  art_iterator_t *in_stack_ffffffffffffffb8;
  art_node_t *node_00;
  art_indexed_child_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  art_node_t *node_01;
  _Bool local_1;
  
  while( true ) {
    _Var1 = art_is_leaf(in_RDI);
    node_00 = in_stack_ffffffffffffffc0.child;
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      iterator_00 = (art_iterator_t *)((ulong)in_RDI & 0xfffffffffffffffe);
      iVar2 = art_compare_keys((art_key_chunk_t *)node_00,(art_key_chunk_t *)iterator_00);
      if (iVar2 < 0) {
        local_1 = art_iterator_up_and_move(iterator_00,false);
      }
      else {
        local_1 = art_iterator_valid_loc(in_RSI,(art_leaf_t *)iterator_00);
      }
      return local_1;
    }
    node_01 = in_RDI;
    in_stack_ffffffffffffffd4 =
         art_compare_prefix((art_key_chunk_t *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc0._15_1_,(art_key_chunk_t *)node_00,
                            (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
                            (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
    if (in_stack_ffffffffffffffd4 < 0) {
      _Var1 = art_iterator_up_and_move(in_stack_ffffffffffffffb8,false);
      return _Var1;
    }
    if (0 < in_stack_ffffffffffffffd4) {
      _Var1 = art_node_init_iterator(node_01,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
      return _Var1;
    }
    in_stack_ffffffffffffffd0 =
         CONCAT13(*(undefined1 *)(in_RDX + (int)((uint)in_RSI->depth + (uint)(byte)in_RDI[1])),
                  (int3)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffc0 =
         art_node_lower_bound(node_00,(art_key_chunk_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38));
    if (in_stack_ffffffffffffffc0.child == (art_node_t *)0x0) break;
    if ((byte)((uint)in_stack_ffffffffffffffd0 >> 0x18) < in_stack_ffffffffffffffc0.key_chunk) {
      art_iterator_down((art_iterator_t *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0.child._7_1_);
      _Var1 = art_node_init_iterator(node_01,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
      return _Var1;
    }
    art_iterator_down((art_iterator_t *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0.child._7_1_);
    in_RDI = in_stack_ffffffffffffffc0.child;
  }
  _Var1 = art_iterator_up_and_move(in_stack_ffffffffffffffb8,false);
  return _Var1;
}

Assistant:

static bool art_node_iterator_lower_bound(const art_node_t *node,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(node)) {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return the
            // next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first leaf.
            return art_node_init_iterator(node, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child =
            art_node_lower_bound(node, key_chunk);
        if (indexed_child.child == NULL) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, inner_node, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, inner_node, indexed_child.index);
        node = indexed_child.child;
    }
    art_leaf_t *leaf = CAST_LEAF(node);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, leaf);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the next
    // leaf.
    return art_iterator_up_and_move(iterator, true);
}